

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::setFlagOption(Federate *this,int flag,bool flagValue)

{
  byte bVar1;
  Modes MVar2;
  element_type *peVar3;
  byte in_DL;
  uint in_ESI;
  long in_RDI;
  
  bVar1 = in_DL & 1;
  if (in_ESI == 0) {
    MVar2 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x310d24);
    if ((char)MVar2 < '\x01') {
      *(byte *)(in_RDI + 0xc) = bVar1;
    }
  }
  if (in_ESI == 0x6a) {
    *(byte *)(in_RDI + 0xd) = bVar1;
  }
  else {
    peVar3 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x310d5d);
    (*peVar3->_vptr_Core[0x22])(peVar3,(ulong)*(uint *)(in_RDI + 0x10),(ulong)in_ESI,(ulong)bVar1);
  }
  return;
}

Assistant:

void Federate::setFlagOption(int flag, bool flagValue)
{
    if (flag == defs::Flags::OBSERVER && currentMode < Modes::INITIALIZING) {
        observerMode = flagValue;
    }
    if (flag == defs::Flags::AUTOMATED_TIME_REQUEST) {
        retriggerTimeRequest = flagValue;
        return;
    }
    coreObject->setFlagOption(fedID, flag, flagValue);
}